

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.h
# Opt level: O0

void __thiscall
mp::Error::Error<std::__cxx11::string,double>
          (Error *this,CStringRef arg0,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,double *args_1)

{
  uint64_t types;
  EVP_PKEY_CTX *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  StringValue<char> SVar1;
  Type array;
  double *in_stack_ffffffffffffff58;
  RuntimeError *in_stack_ffffffffffffff60;
  anon_union_16_12_986ea841_for_Value_0 *first;
  ArgList local_70;
  EVP_PKEY_CTX *local_60;
  anon_union_16_12_986ea841_for_Value_0 local_48;
  anon_union_16_12_986ea841_for_Value_0 local_38 [3];
  EVP_PKEY_CTX *local_8;
  
  local_8 = in_RSI;
  fmt::internal::RuntimeError::RuntimeError(in_stack_ffffffffffffff60);
  *(undefined ***)in_RDI = &PTR__Error_0023d3d0;
  *(undefined4 *)&in_RDI->field_2 = 1;
  local_48.string =
       (StringValue<char>)
       fmt::internal::ArgArray<2u,true>::
       make<fmt::BasicFormatter<char,fmt::ArgFormatter<char>>,std::__cxx11::string>(in_RDI);
  first = local_38;
  SVar1 = (StringValue<char>)
          fmt::internal::ArgArray<2u,true>::
          make<fmt::BasicFormatter<char,fmt::ArgFormatter<char>>,double>((double *)in_RDI);
  first->string = SVar1;
  local_60 = local_8;
  types = fmt::internal::make_type<std::__cxx11::string,double>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &first->string,in_stack_ffffffffffffff58);
  fmt::ArgList::ArgList(&local_70,types,(Value *)&local_48.string);
  init((Error *)in_RDI,local_60);
  return;
}

Assistant:

Error(fmt::CStringRef msg, int c=-1) : exit_code_(c)
  { SetMessage(msg.c_str()); }